

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddDecomp.c
# Opt level: O1

int Cudd_bddGenConjDecomp(DdManager *dd,DdNode *f,DdNode ***conjuncts)

{
  int *piVar1;
  bool bVar2;
  DdManager *dd_00;
  DdNode *node;
  int iVar3;
  int iVar4;
  st__table *table;
  char *value;
  NodeStat *pNVar5;
  st__generator *psVar6;
  long lVar7;
  st__table *ghTable;
  Conjuncts *pCVar8;
  DdNode **ppDVar9;
  int approxDistance;
  st__table *mintermTable;
  double dVar10;
  DdNode *local_80;
  DdNode *local_78;
  st__table *local_70;
  Conjuncts *local_68;
  DdManager *local_60;
  DdNode ***local_58;
  DdNode *local_50;
  Conjuncts *local_48;
  ulong local_40;
  char *key;
  
  one = dd->one;
  zero = (DdNode *)((ulong)one ^ 1);
  local_40 = (ulong)f & 0xfffffffffffffffe;
  local_60 = dd;
  local_58 = conjuncts;
  local_50 = f;
  do {
    dd->reordered = 0;
    table = st__init_table(st__ptrcmp,st__ptrhash);
    if (table == (st__table *)0x0) {
      local_80 = (DdNode *)0x0;
      local_78 = (DdNode *)0x0;
      ghTable = (st__table *)0x0;
      mintermTable = (st__table *)0x0;
      local_70 = (st__table *)0x0;
      table = (st__table *)0x0;
LAB_00777ccb:
      do {
        if (table != (st__table *)0x0) {
          do {
            psVar6 = st__init_gen(table);
          } while (psVar6 == (st__generator *)0x0);
          while (iVar3 = st__gen(psVar6,&key,(char **)&local_68), iVar3 != 0) {
            if (local_68 != (Conjuncts *)0x0) {
              free(local_68);
              local_68 = (Conjuncts *)0x0;
            }
          }
          st__free_gen(psVar6);
          st__free_table(table);
        }
        if (mintermTable != (st__table *)0x0) {
          psVar6 = st__init_gen(mintermTable);
          table = (st__table *)0x0;
          if (psVar6 == (st__generator *)0x0) goto LAB_00777ccb;
          while (iVar3 = st__gen(psVar6,&key,(char **)&local_68), iVar3 != 0) {
            if (local_68 != (Conjuncts *)0x0) {
              free(local_68);
              local_68 = (Conjuncts *)0x0;
            }
          }
          st__free_gen(psVar6);
          st__free_table(mintermTable);
        }
        if (ghTable != (st__table *)0x0) {
          st__free_table(ghTable);
        }
        if (local_70 == (st__table *)0x0) goto LAB_00777def;
        psVar6 = st__init_gen(local_70);
        mintermTable = (st__table *)0x0;
        table = (st__table *)0x0;
      } while (psVar6 == (st__generator *)0x0);
      iVar3 = st__gen(psVar6,&key,(char **)&local_68);
      dd_00 = local_60;
      while (iVar3 != 0) {
        ConjunctsFree(dd_00,local_68);
        iVar3 = st__gen(psVar6,&key,(char **)&local_68);
      }
      st__free_gen(psVar6);
      st__free_table(local_70);
LAB_00777def:
      local_60->errorCode = CUDD_MEMORY_OUT;
      bVar2 = true;
      f = local_50;
      dd = local_60;
    }
    else {
      value = (char *)malloc(8);
      if (value == (char *)0x0) {
LAB_00777cab:
        local_80 = (DdNode *)0x0;
        local_78 = (DdNode *)0x0;
LAB_00777cbd:
        ghTable = (st__table *)0x0;
        mintermTable = (st__table *)0x0;
        local_70 = (st__table *)0x0;
        goto LAB_00777ccb;
      }
      value[0] = '\0';
      value[1] = '\0';
      value[2] = '\0';
      value[3] = '\0';
      value[4] = '\x01';
      value[5] = '\0';
      value[6] = '\0';
      value[7] = '\0';
      iVar3 = st__insert(table,(char *)one,value);
      if ((iVar3 == -10000) || (pNVar5 = CreateBotDist(f,table), pNVar5 == (NodeStat *)0x0))
      goto LAB_00777cab;
      iVar3 = pNVar5->distance;
      approxDistance = 5;
      if (5 < iVar3) {
        approxDistance = iVar3;
      }
      if (4 < iVar3) {
        psVar6 = st__init_gen(table);
        if (psVar6 != (st__generator *)0x0) {
          iVar4 = st__gen(psVar6,&key,(char **)&local_68);
          iVar3 = 0;
          while (iVar4 != 0) {
            iVar4 = *(int *)((long)&local_68->g + 4);
            if (iVar3 < iVar4) {
              iVar3 = iVar4;
            }
            iVar4 = st__gen(psVar6,&key,(char **)&local_68);
          }
          st__free_gen(psVar6);
          node = local_50;
          iVar4 = Cudd_SupportSize(dd,local_50);
          dVar10 = ldexp(1.0,iVar4);
          mintermTable = st__init_table(st__ptrcmp,st__ptrhash);
          if (mintermTable != (st__table *)0x0) {
            dVar10 = CountMinterms(node,dVar10,mintermTable,dd->err);
            if ((dVar10 != -1.0) || (NAN(dVar10))) {
              lVar7 = Cudd_Random();
              lastTimeG = (long)((uint)lVar7 & 1);
              local_70 = st__init_table(st__ptrcmp,st__ptrhash);
              if (local_70 != (st__table *)0x0) {
                ghTable = st__init_table(st__ptrcmp,st__ptrhash);
                if (ghTable == (st__table *)0x0) {
                  local_80 = (DdNode *)0x0;
                  local_78 = (DdNode *)0x0;
                  ghTable = (st__table *)0x0;
                }
                else {
                  pCVar8 = BuildConjuncts(local_60,node,table,local_70,approxDistance,iVar3,ghTable,
                                          mintermTable);
                  if ((pCVar8 == (Conjuncts *)0x0) ||
                     (local_48 = pCVar8, psVar6 = st__init_gen(table),
                     psVar6 == (st__generator *)0x0)) {
                    local_80 = (DdNode *)0x0;
                    local_78 = (DdNode *)0x0;
                  }
                  else {
                    while (iVar3 = st__gen(psVar6,&key,(char **)&local_68), iVar3 != 0) {
                      if (local_68 != (Conjuncts *)0x0) {
                        free(local_68);
                        local_68 = (Conjuncts *)0x0;
                      }
                    }
                    st__free_gen(psVar6);
                    st__free_table(table);
                    st__free_table(ghTable);
                    psVar6 = st__init_gen(mintermTable);
                    if (psVar6 == (st__generator *)0x0) {
                      local_80 = (DdNode *)0x0;
                      local_78 = (DdNode *)0x0;
                      ghTable = (st__table *)0x0;
                      table = (st__table *)0x0;
                    }
                    else {
                      while (iVar3 = st__gen(psVar6,&key,(char **)&local_68), iVar3 != 0) {
                        if (local_68 != (Conjuncts *)0x0) {
                          free(local_68);
                          local_68 = (Conjuncts *)0x0;
                        }
                      }
                      st__free_gen(psVar6);
                      st__free_table(mintermTable);
                      f = local_50;
                      dd = local_60;
                      pCVar8 = (Conjuncts *)((ulong)local_48 ^ 1);
                      if (((ulong)local_48 & 1) == 0) {
                        pCVar8 = local_48;
                      }
                      if (pCVar8 == (Conjuncts *)0x0) {
                        local_80 = (DdNode *)0x0;
                        local_78 = (DdNode *)0x0;
                      }
                      else {
                        local_80 = pCVar8->g;
                        local_78 = pCVar8->h;
                        piVar1 = (int *)(((ulong)local_80 & 0xfffffffffffffffe) + 4);
                        *piVar1 = *piVar1 + 1;
                        piVar1 = (int *)(((ulong)local_78 & 0xfffffffffffffffe) + 4);
                        *piVar1 = *piVar1 + 1;
                        if (((ulong)local_48 & 1) != 0) {
                          free(pCVar8);
                        }
                      }
                      psVar6 = st__init_gen(local_70);
                      if (psVar6 != (st__generator *)0x0) {
                        while (iVar3 = st__gen(psVar6,&key,(char **)&local_68), iVar3 != 0) {
                          ConjunctsFree(dd,local_68);
                        }
                        st__free_gen(psVar6);
                        st__free_table(local_70);
                        bVar2 = false;
                        goto LAB_00777e06;
                      }
                      ghTable = (st__table *)0x0;
                      mintermTable = (st__table *)0x0;
                      table = (st__table *)0x0;
                    }
                  }
                }
                goto LAB_00777ccb;
              }
            }
            local_80 = (DdNode *)0x0;
            local_78 = (DdNode *)0x0;
            ghTable = (st__table *)0x0;
            local_70 = (st__table *)0x0;
            goto LAB_00777ccb;
          }
        }
        goto LAB_00777cab;
      }
      local_78 = dd->one;
      *(int *)(local_40 + 4) = *(int *)(local_40 + 4) + 1;
      piVar1 = (int *)(((ulong)local_78 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      psVar6 = st__init_gen(table);
      local_80 = f;
      if (psVar6 == (st__generator *)0x0) goto LAB_00777cbd;
      while (iVar3 = st__gen(psVar6,&key,(char **)&local_68), iVar3 != 0) {
        if (local_68 != (Conjuncts *)0x0) {
          free(local_68);
          local_68 = (Conjuncts *)0x0;
        }
      }
      st__free_gen(psVar6);
      st__free_table(table);
      bVar2 = false;
    }
LAB_00777e06:
    if (dd->reordered != 1) {
      if (bVar2) {
        return 0;
      }
      if (local_80 == one) {
        Cudd_RecursiveDeref(dd,local_80);
        ppDVar9 = (DdNode **)malloc(8);
        *local_58 = ppDVar9;
        if (ppDVar9 != (DdNode **)0x0) {
          *ppDVar9 = local_78;
          return 1;
        }
      }
      else if (local_78 == one) {
        Cudd_RecursiveDeref(dd,local_78);
        ppDVar9 = (DdNode **)malloc(8);
        *local_58 = ppDVar9;
        local_78 = local_80;
        if (ppDVar9 != (DdNode **)0x0) {
          *ppDVar9 = local_80;
          return 1;
        }
      }
      else {
        ppDVar9 = (DdNode **)malloc(0x10);
        *local_58 = ppDVar9;
        if (ppDVar9 != (DdNode **)0x0) {
          *ppDVar9 = local_80;
          ppDVar9[1] = local_78;
          return 2;
        }
        Cudd_RecursiveDeref(dd,local_80);
      }
      Cudd_RecursiveDeref(dd,local_78);
      dd->errorCode = CUDD_MEMORY_OUT;
      return 0;
    }
  } while( true );
}

Assistant:

int
Cudd_bddGenConjDecomp(
  DdManager * dd /* manager */,
  DdNode * f /* function to be decomposed */,
  DdNode *** conjuncts /* address of the array of conjuncts */)
{
    int result;
    DdNode *glocal, *hlocal;

    one = DD_ONE(dd);
    zero = Cudd_Not(one);
    
    do {
        dd->reordered = 0;
        result = cuddConjunctsAux(dd, f, &glocal, &hlocal);
    } while (dd->reordered == 1);

    if (result == 0) {
        return(0);
    }

    if (glocal != one) {
        if (hlocal != one) {
            *conjuncts = ABC_ALLOC(DdNode *,2);
            if (*conjuncts == NULL) {
                Cudd_RecursiveDeref(dd,glocal);
                Cudd_RecursiveDeref(dd,hlocal);
                dd->errorCode = CUDD_MEMORY_OUT;
                return(0);
            }
            (*conjuncts)[0] = glocal;
            (*conjuncts)[1] = hlocal;
            return(2);
        } else {
            Cudd_RecursiveDeref(dd,hlocal);
            *conjuncts = ABC_ALLOC(DdNode *,1);
            if (*conjuncts == NULL) {
                Cudd_RecursiveDeref(dd,glocal);
                dd->errorCode = CUDD_MEMORY_OUT;
                return(0);
            }
            (*conjuncts)[0] = glocal;
            return(1);
        }
    } else {
        Cudd_RecursiveDeref(dd,glocal);
        *conjuncts = ABC_ALLOC(DdNode *,1);
        if (*conjuncts == NULL) {
            Cudd_RecursiveDeref(dd,hlocal);
            dd->errorCode = CUDD_MEMORY_OUT;
            return(0);
        }
        (*conjuncts)[0] = hlocal;
        return(1);
    }

}